

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O3

pcp_errno run_server_state_machine(pcp_server_t *s,pcp_event_e event)

{
  pcp_server_state_e pVar1;
  long lVar2;
  
  if (s == (pcp_server_t *)0x0) {
    return PCP_ERR_BAD_ARGS;
  }
  lVar2 = 8;
  while (((*(pcp_server_state_e *)(lVar2 + 0x10c428) != pss_any &&
          (*(pcp_server_state_e *)(lVar2 + 0x10c428) != s->server_state)) ||
         ((*(pcp_event_e *)(lVar2 + 0x10c42c) != pcpe_any &&
          (*(pcp_event_e *)(lVar2 + 0x10c42c) != event))))) {
    lVar2 = lVar2 + 0x10;
    if (lVar2 == 0xf8) {
      return PCP_ERR_SUCCESS;
    }
  }
  pVar1 = (**(code **)((long)&server_sm[0].state + lVar2))(s);
  s->server_state = pVar1;
  return PCP_ERR_SUCCESS;
}

Assistant:

pcp_errno run_server_state_machine(pcp_server_t *s, pcp_event_e event) {
    unsigned i;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);
    if (!s) {
        return PCP_ERR_BAD_ARGS;
    }

    for (i = 0; i < SERVER_STATE_MACHINE_COUNT; ++i) {
        pcp_server_state_machine_t *state_def = server_sm + i;
        if ((state_def->state == s->server_state) ||
            (state_def->state == pss_any)) {
            if ((state_def->event == pcpe_any) || (state_def->event == event)) {
                PCP_LOG_DEBUG("Executing server state handler %s\n    server "
                              "\t: %s (index %d)\n"
                              "    state\t: %s\n"
                              "    event\t: %s",
                              dbg_get_func_name(state_def->handler),
                              s->pcp_server_paddr, s->index,
                              dbg_get_sstate_name(s->server_state),
                              dbg_get_sevent_name(event));

                s->server_state = state_def->handler(s);

                PCP_LOG_DEBUG("Return from server state handler's %s \n    "
                              "result state: %s",
                              dbg_get_func_name(state_def->handler),
                              dbg_get_sstate_name(s->server_state));

                break;
            }
        }
    }
    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return PCP_ERR_SUCCESS;
}